

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O3

int parsenetrc(store_netrc *store,char *host,char **loginp,char **passwordp,char *netrcfile)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  CURLcode CVar9;
  FILE *__stream;
  char *pcVar10;
  byte *__s;
  undefined4 extraout_var;
  ulong uVar11;
  undefined4 extraout_var_00;
  undefined7 uVar13;
  undefined8 uVar12;
  uint uVar14;
  size_t len;
  byte *pbVar15;
  store_netrc *s_00;
  uint uVar16;
  char s;
  dynbuf token;
  dynbuf local_b0;
  ulong local_90;
  ulong local_88;
  store_netrc *local_80;
  ulong local_78;
  byte *local_70;
  char **local_68;
  char **local_60;
  char *local_58;
  dynbuf local_50;
  
  pcVar4 = *loginp;
  pcVar5 = *passwordp;
  local_60 = passwordp;
  local_58 = host;
  Curl_dyn_init(&local_50,0x80);
  if ((store->field_0x28 & 1) == 0) {
    __stream = fopen64(netrcfile,"r");
    Curl_dyn_init(&local_b0,0x1000);
    if (__stream == (FILE *)0x0) {
      Curl_dyn_free(&local_b0);
    }
    else {
      iVar8 = Curl_get_line(&local_b0,(FILE *)__stream);
      if (iVar8 != 0) {
        do {
          for (pcVar10 = Curl_dyn_ptr(&local_b0);
              (cVar2 = *pcVar10, cVar2 == '\t' || (cVar2 == ' ')); pcVar10 = pcVar10 + 1) {
          }
          if ((cVar2 != '#') && (CVar9 = Curl_dyn_add(&store->filebuf,pcVar10), CVar9 != CURLE_OK))
          {
            Curl_dyn_free(&local_b0);
            fclose(__stream);
            return -1;
          }
          iVar8 = Curl_get_line(&local_b0,(FILE *)__stream);
        } while (iVar8 != 0);
      }
      Curl_dyn_free(&local_b0);
      fclose(__stream);
    }
    store->field_0x28 = store->field_0x28 | 1;
  }
  local_68 = loginp;
  __s = (byte *)Curl_dyn_ptr(&store->filebuf);
  if (__s != (byte *)0x0) {
    local_78 = 0;
    uVar16 = 0;
    local_88 = 0;
    local_90 = 0;
    local_80 = store;
    do {
      local_70 = __s;
      Curl_dyn_reset(&local_50);
      pbVar15 = __s + 2;
      while( true ) {
        bVar3 = *__s;
        if ((bVar3 != 0x20) && (bVar3 != 9)) break;
        pbVar15 = pbVar15 + 1;
        __s = __s + 1;
      }
      uVar14 = (uint)(bVar3 != 0xd) * 3;
      if (bVar3 == 10) {
        uVar14 = 0;
      }
      if (uVar16 != 3) {
        uVar14 = uVar16;
      }
      uVar16 = uVar14;
      if (bVar3 == 0x22) {
        bVar3 = __s[1];
        uVar11 = (ulong)bVar3;
        if (bVar3 != 0) {
          bVar6 = false;
          do {
            local_b0.bufr._0_1_ = (char)uVar11;
            uVar14 = (uint)uVar11 & 0xff;
            if (bVar6) {
              if ((char)local_b0.bufr == 't') {
                local_b0.bufr._0_1_ = '\t';
              }
              else if (uVar14 == 0x72) {
                local_b0.bufr._0_1_ = '\r';
              }
              else if (uVar14 == 0x6e) {
                local_b0.bufr._0_1_ = '\n';
              }
              bVar6 = false;
LAB_00146f2a:
              CVar9 = Curl_dyn_addn(&local_50,&local_b0,1);
              uVar11 = CONCAT44(extraout_var_00,CVar9);
              bVar7 = bVar6;
              if (CVar9 != CURLE_OK) goto LAB_001472e1;
            }
            else {
              bVar7 = true;
              if ((char)local_b0.bufr != '\\') {
                if (uVar14 != 0x22) goto LAB_00146f2a;
                uVar12 = 0;
                goto LAB_00146f5e;
              }
            }
            bVar6 = bVar7;
            bVar3 = *pbVar15;
            uVar13 = (undefined7)(uVar11 >> 8);
            uVar11 = CONCAT71(uVar13,bVar3);
            pbVar15 = pbVar15 + 1;
          } while (bVar3 != 0);
          uVar12 = CONCAT71(uVar13,1);
LAB_00146f5e:
          if (((char)uVar12 == '\0') && (!bVar6)) {
LAB_00146f75:
            if (((pcVar4 == (char *)0x0) || (pcVar5 == (char *)0x0 || *pcVar4 == '\0')) ||
               (*pcVar5 == '\0')) {
              Curl_dyn_ptr(&local_50);
              iVar8 = (*(code *)(&DAT_00177c28 + *(int *)(&DAT_00177c28 + (ulong)uVar16 * 4)))();
              return iVar8;
            }
            local_78 = CONCAT71((int7)((ulong)uVar12 >> 8),1);
            __s = local_70;
            goto LAB_0014721f;
          }
        }
LAB_001472e1:
        Curl_dyn_free(&local_50);
        iVar8 = -1;
        s_00 = local_80;
        goto LAB_001472f9;
      }
      if ((bVar3 != 0) && (bVar3 != 10)) {
        len = 0;
        pbVar15 = __s;
        while (((bVar3 != 9 && (bVar3 != 0x20)) && ((byte)(bVar3 - 0xe) < 0xfc))) {
          len = len + 1;
          pbVar1 = pbVar15 + 1;
          pbVar15 = pbVar15 + 1;
          bVar3 = *pbVar1;
        }
        if (len != 0) {
          CVar9 = Curl_dyn_addn(&local_50,__s,len);
          uVar12 = CONCAT44(extraout_var,CVar9);
          if (CVar9 == CURLE_OK) goto LAB_00146f75;
        }
        goto LAB_001472e1;
      }
      pcVar10 = strchr((char *)__s,10);
      s_00 = local_80;
      if (pcVar10 == (char *)0x0) goto LAB_0014725e;
      __s = (byte *)(pcVar10 + 1);
LAB_0014721f:
      s_00 = local_80;
      if (((local_78 & 1) != 0) || (__s == (byte *)0x0)) goto LAB_0014725e;
    } while( true );
  }
  local_90 = 0;
  local_88 = 0;
  s_00 = store;
LAB_0014725e:
  Curl_dyn_free(&local_50);
  iVar8 = 1;
LAB_001472f9:
  Curl_dyn_free(&s_00->filebuf);
  if ((local_90 & 1) != 0) {
    (*Curl_cfree)(pcVar4);
  }
  if ((local_88 & 1) != 0) {
    (*Curl_cfree)(pcVar5);
  }
  return iVar8;
}

Assistant:

static int parsenetrc(struct store_netrc *store,
                      const char *host,
                      char **loginp,
                      char **passwordp,
                      const char *netrcfile)
{
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;
  enum found_state found = NONE;
  bool our_login = TRUE;  /* With specific_login, found *our* login name (or
                             login-less line) */
  bool done = FALSE;
  char *netrcbuffer;
  struct dynbuf token;
  struct dynbuf *filebuf = &store->filebuf;
  Curl_dyn_init(&token, MAX_NETRC_TOKEN);

  if(!store->loaded) {
    if(file2memory(netrcfile, filebuf))
      return NETRC_FAILED;
    store->loaded = TRUE;
  }

  netrcbuffer = Curl_dyn_ptr(filebuf);

  while(!done) {
    char *tok = netrcbuffer;
    while(tok) {
      char *tok_end;
      bool quoted;
      Curl_dyn_reset(&token);
      while(ISBLANK(*tok))
        tok++;
      /* tok is first non-space letter */
      if(state == MACDEF) {
        if((*tok == '\n') || (*tok == '\r'))
          state = NOTHING; /* end of macro definition */
      }

      if(!*tok || (*tok == '\n'))
        /* end of line  */
        break;

      /* leading double-quote means quoted string */
      quoted = (*tok == '\"');

      tok_end = tok;
      if(!quoted) {
        size_t len = 0;
        while(!ISSPACE(*tok_end)) {
          tok_end++;
          len++;
        }
        if(!len || Curl_dyn_addn(&token, tok, len)) {
          retcode = NETRC_FAILED;
          goto out;
        }
      }
      else {
        bool escape = FALSE;
        bool endquote = FALSE;
        tok_end++; /* pass the leading quote */
        while(*tok_end) {
          char s = *tok_end;
          if(escape) {
            escape = FALSE;
            switch(s) {
            case 'n':
              s = '\n';
              break;
            case 'r':
              s = '\r';
              break;
            case 't':
              s = '\t';
              break;
            }
          }
          else if(s == '\\') {
            escape = TRUE;
            tok_end++;
            continue;
          }
          else if(s == '\"') {
            tok_end++; /* pass the ending quote */
            endquote = TRUE;
            break;
          }
          if(Curl_dyn_addn(&token, &s, 1)) {
            retcode = NETRC_FAILED;
            goto out;
          }
          tok_end++;
        }
        if(escape || !endquote) {
          /* bad syntax, get out */
          retcode = NETRC_FAILED;
          goto out;
        }
      }

      if((login && *login) && (password && *password)) {
        done = TRUE;
        break;
      }

      tok = Curl_dyn_ptr(&token);

      switch(state) {
      case NOTHING:
        if(strcasecompare("macdef", tok))
          /* Define a macro. A macro is defined with the specified name; its
             contents begin with the next .netrc line and continue until a
             null line (consecutive new-line characters) is encountered. */
          state = MACDEF;
        else if(strcasecompare("machine", tok))
          /* the next tok is the machine name, this is in itself the delimiter
             that starts the stuff entered for this machine, after this we
             need to search for 'login' and 'password'. */
          state = HOSTFOUND;
        else if(strcasecompare("default", tok)) {
          state = HOSTVALID;
          retcode = NETRC_SUCCESS; /* we did find our host */
        }
        break;
      case MACDEF:
        if(!*tok)
          state = NOTHING;
        break;
      case HOSTFOUND:
        if(strcasecompare(host, tok)) {
          /* and yes, this is our host! */
          state = HOSTVALID;
          retcode = NETRC_SUCCESS; /* we did find our host */
        }
        else
          /* not our host */
          state = NOTHING;
        break;
      case HOSTVALID:
        /* we are now parsing sub-keywords concerning "our" host */
        if(found == LOGIN) {
          if(specific_login) {
            our_login = !Curl_timestrcmp(login, tok);
          }
          else if(!login || Curl_timestrcmp(login, tok)) {
            if(login_alloc)
              free(login);
            login = strdup(tok);
            if(!login) {
              retcode = NETRC_FAILED; /* allocation failed */
              goto out;
            }
            login_alloc = TRUE;
          }
          found = NONE;
        }
        else if(found == PASSWORD) {
          if((our_login || !specific_login) &&
             (!password || Curl_timestrcmp(password, tok))) {
            if(password_alloc)
              free(password);
            password = strdup(tok);
            if(!password) {
              retcode = NETRC_FAILED; /* allocation failed */
              goto out;
            }
            password_alloc = TRUE;
          }
          found = NONE;
        }
        else if(strcasecompare("login", tok))
          found = LOGIN;
        else if(strcasecompare("password", tok))
          found = PASSWORD;
        else if(strcasecompare("machine", tok)) {
          /* ok, there is machine here go => */
          state = HOSTFOUND;
          found = NONE;
        }
        break;
      } /* switch (state) */
      tok = ++tok_end;
    }
    if(!done) {
      char *nl = NULL;
      if(tok)
        nl = strchr(tok, '\n');
      if(!nl)
        break;
      /* point to next line */
      netrcbuffer = &nl[1];
    }
  } /* while !done */

out:
  Curl_dyn_free(&token);
  if(!retcode) {
    /* success */
    if(login_alloc) {
      free(*loginp);
      *loginp = login;
    }
    if(password_alloc) {
      free(*passwordp);
      *passwordp = password;
    }
  }
  else {
    Curl_dyn_free(filebuf);
    if(login_alloc)
      free(login);
    if(password_alloc)
      free(password);
  }

  return retcode;
}